

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fVertexArrayTest.cpp
# Opt level: O1

string * __thiscall
deqp::gles3::Functional::MultiVertexArrayStorageTests::getTestName_abi_cxx11_
          (string *__return_storage_ptr__,MultiVertexArrayStorageTests *this,Spec *spec)

{
  string *psVar1;
  Storage storage;
  long lVar2;
  long lVar3;
  stringstream name;
  string local_1e0;
  string *local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
  local_1c0 = __return_storage_ptr__;
  if (0 < (int)((ulong)((long)(spec->arrays).
                              super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(spec->arrays).
                             super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                             ._M_impl.super__Vector_impl_data._M_start) >> 6)) {
    lVar2 = 8;
    lVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"_",1);
      deqp::gls::Array::storageToString_abi_cxx11_
                (&local_1e0,
                 (Array *)(ulong)*(uint *)((long)&((spec->arrays).
                                                                                                      
                                                  super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->
                                                  inputType + lVar2),storage);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,local_1e0._M_dataplus._M_p,local_1e0._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1e0._M_dataplus._M_p != &local_1e0.field_2) {
        operator_delete(local_1e0._M_dataplus._M_p,local_1e0.field_2._M_allocated_capacity + 1);
      }
      lVar3 = lVar3 + 1;
      lVar2 = lVar2 + 0x40;
    } while (lVar3 < (int)((ulong)((long)(spec->arrays).
                                         super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                  (long)(spec->arrays).
                                        super__Vector_base<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec,_std::allocator<deqp::gls::MultiVertexArrayTest::Spec::ArraySpec>_>
                                        ._M_impl.super__Vector_impl_data._M_start) >> 6));
  }
  psVar1 = local_1c0;
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return psVar1;
}

Assistant:

std::string MultiVertexArrayStorageTests::getTestName (const MultiVertexArrayTest::Spec& spec)
{
	std::stringstream name;
	name
		<< spec.arrays.size();

	for (int arrayNdx = 0; arrayNdx < (int)spec.arrays.size(); arrayNdx++)
	{
		name
			<< "_"
			<< Array::storageToString(spec.arrays[arrayNdx].storage);
	}

	return name.str();
}